

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::FunctionCreationContext
          (FunctionCreationContext *this,TranslateToFuzzReader *parent,Function *func)

{
  undefined1 local_110 [8];
  Finder finder;
  Function *func_local;
  TranslateToFuzzReader *parent_local;
  FunctionCreationContext *this_local;
  
  this->parent = parent;
  this->func = func;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&this->breakableStack);
  this->labelIndex = 0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&this->hangStack);
  std::
  unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->typeLocals);
  parent->funcContext = this;
  computeTypeLocals(this);
  if (func->body != (Expression *)0x0) {
    FunctionCreationContext::Finder::Finder((Finder *)local_110);
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::walk
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)local_110,
               &func->body);
    this->labelIndex =
         (Index)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currModule;
    FunctionCreationContext::Finder::~Finder((Finder *)local_110);
  }
  return;
}

Assistant:

TranslateToFuzzReader::FunctionCreationContext::FunctionCreationContext(
  TranslateToFuzzReader& parent, Function* func)
  : parent(parent), func(func) {
  parent.funcContext = this;

  // Note the types of all locals.
  computeTypeLocals();

  // Find the right index for labelIndex: we emit names like label$5, so we need
  // the index to be larger than all currently existing.
  if (!func->body) {
    return;
  }

  struct Finder : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
    Index maxIndex = 0;

    void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (name.startsWith("label$")) {
            auto str = name.toString();
            str = str.substr(6);
            Index index = atoi(str.c_str());
            maxIndex = std::max(maxIndex, index + 1);
          }
        }
      });
    }
  } finder;
  finder.walk(func->body);
  labelIndex = finder.maxIndex;
}